

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

EVP_HPKE_AEAD * bssl::get_ech_aead(uint16_t aead_id)

{
  uint16_t uVar1;
  EVP_HPKE_AEAD *aead;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x18) {
      return (EVP_HPKE_AEAD *)0x0;
    }
    aead = (EVP_HPKE_AEAD *)(**(code **)((long)&kSupportedAEADs + lVar2))();
    uVar1 = EVP_HPKE_AEAD_id(aead);
    lVar2 = lVar2 + 8;
  } while (uVar1 != aead_id);
  return aead;
}

Assistant:

static const EVP_HPKE_AEAD *get_ech_aead(uint16_t aead_id) {
  for (const auto aead_func : kSupportedAEADs) {
    const EVP_HPKE_AEAD *aead = aead_func();
    if (aead_id == EVP_HPKE_AEAD_id(aead)) {
      return aead;
    }
  }
  return nullptr;
}